

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleExtract(TranslateToFuzzReader *this,Type type)

{
  value_type_conflict3 vVar1;
  char cVar2;
  uint32_t uVar3;
  Type *pTVar4;
  uintptr_t *puVar5;
  size_t sVar6;
  value_type_conflict3 *pvVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  Iterator __first;
  Iterator __last;
  Type local_98;
  Tuple local_90;
  ulong local_78;
  size_t injected;
  size_t i;
  Type tupleType;
  Iterator __begin1;
  undefined1 auStack_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> extractIndices;
  Type type_local;
  
  cVar2 = ::wasm::Type::isDefaultable();
  if (cVar2 == '\0') {
    pEVar9 = makeTrivial(this,type);
  }
  else {
    if (((this->wasm->features).features & 0x200) == 0) {
      __assert_fail("wasm.features.hasMultivalue()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x61f,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    if (((type.id < 2) || (cVar2 = ::wasm::Type::isTuple(), cVar2 != '\0')) || (type.id < 2)) {
      __assert_fail("type.isSingle() && type.isConcrete()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x620,"Expression *wasm::TranslateToFuzzReader::makeTupleExtract(Type)");
    }
    i = (size_t)getTupleType(this);
    extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_48 = (undefined1  [8])0x0;
    extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    injected = 0;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    tupleType.id = (uintptr_t)&i;
    pTVar4 = (Type *)::wasm::Type::size();
    if (pTVar4 == (Type *)0x0) goto LAB_0013ee7c;
    do {
      do {
        puVar5 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)&tupleType);
        if (*puVar5 == type.id) {
          if (extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_48,
                       (iterator)
                       extractIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,&injected);
          }
          else {
            *extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start = injected;
            extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start =
                 extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        injected = injected + 1;
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               != pTVar4);
LAB_0013ee7c:
    } while ((size_t *)tupleType.id != &i);
    if ((undefined1  [8])
        extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == auStack_48) {
      sVar6 = ::wasm::Type::size();
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)&i;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar6;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)&i
      ;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&tupleType,__first,__last,
                 (allocator_type *)&local_90);
      uVar3 = Random::upTo(&this->random,
                           (uint32_t)
                           ((long)__begin1.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .parent - tupleType.id >> 3));
      local_78 = (ulong)uVar3;
      *(uintptr_t *)(tupleType.id + local_78 * 8) = type.id;
      Tuple::Tuple(&local_90,(TypeList *)&tupleType);
      ::wasm::Type::Type(&local_98,&local_90);
      i = local_98.id;
      if (local_90.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.types.
                              super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.types.
                              super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_48,
                   (iterator)
                   extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,&local_78);
      }
      else {
        *extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = local_78;
        extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             extractIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      if (tupleType.id != 0) {
        operator_delete((void *)tupleType.id,
                        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index - tupleType.id);
      }
    }
    pvVar7 = Random::pick<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                       (&this->random,
                        (vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_48);
    vVar1 = *pvVar7;
    pEVar8 = make(this,(Type)i);
    pEVar9 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    pEVar9->_id = TupleExtractId;
    (pEVar9->type).id = 0;
    *(Expression **)(pEVar9 + 1) = pEVar8;
    *(int *)&pEVar9[1].type.id = (int)vVar1;
    ::wasm::TupleExtract::finalize();
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48,
                      (long)extractIndices.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
    }
  }
  return pEVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleExtract(Type type) {
  // Tuples can require locals in binary format conversions.
  if (!type.isDefaultable()) {
    return makeTrivial(type);
  }
  assert(wasm.features.hasMultivalue());
  assert(type.isSingle() && type.isConcrete());
  Type tupleType = getTupleType();

  // Find indices from which we can extract `type`
  std::vector<size_t> extractIndices;
  size_t i = 0;
  for (const auto& t : tupleType) {
    if (t == type) {
      extractIndices.push_back(i);
    }
    ++i;
  }

  // If there are none, inject one
  if (extractIndices.size() == 0) {
    std::vector<Type> newElements(tupleType.begin(), tupleType.end());
    size_t injected = upTo(newElements.size());
    newElements[injected] = type;
    tupleType = Type(newElements);
    extractIndices.push_back(injected);
  }

  Index index = pick(extractIndices);
  Expression* child = make(tupleType);
  return builder.makeTupleExtract(child, index);
}